

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Configlist_reset(void)

{
  current = (config *)0x0;
  basis = (config *)0x0;
  currentend = &current;
  basisend = &basis;
  Configtable_clear((_func_int_config_ptr *)0x0);
  return;
}

Assistant:

void Configlist_reset(){
  current = 0;
  currentend = &current;
  basis = 0;
  basisend = &basis;
  Configtable_clear(0);
  return;
}